

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetReader::PrepareRowGroupBuffer
          (ParquetReader *this,ParquetReaderScanState *state,idx_t i)

{
  vector<duckdb_parquet::ColumnChunk,_true> *this_00;
  unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> *this_01;
  LogicalTypeId LVar1;
  ParquetColumnSchemaType PVar2;
  idx_t child_idx;
  ulong __n;
  FilterPropagateResult FVar3;
  FilterPropagateResult FVar4;
  ParquetRowGroup *pPVar5;
  reference pvVar6;
  pointer pCVar7;
  StructColumnReader *this_02;
  ColumnReader *row_group_idx_p;
  reference pvVar8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
  *this_03;
  iterator iVar9;
  pointer pTVar10;
  const_reference pvVar11;
  type pBVar12;
  uint uVar13;
  LogicalType *other;
  bool bVar14;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> stats;
  BaseStatistics nan_stats;
  Value nan_value;
  undefined1 local_140 [16];
  const_reference local_130;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *local_128;
  LogicalType local_120;
  Value local_108;
  BaseStatistics local_c8;
  Value local_70;
  
  pPVar5 = GetGroup(this,state);
  pvVar6 = vector<duckdb::MultiFileLocalColumnId,_true>::get<true>
                     (&(this->super_BaseFileReader).column_ids.column_ids,i);
  child_idx = pvVar6->column_id;
  local_128 = &state->root_reader;
  pCVar7 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->(local_128);
  this_02 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar7);
  row_group_idx_p = StructColumnReader::GetChildReader(this_02,child_idx);
  if ((this->super_BaseFileReader).filters.
      super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
      .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl == (TableFilterSet *)0x0)
  goto LAB_01ebe5b5;
  this_01 = &(this->super_BaseFileReader).filters;
  pvVar8 = vector<unsigned_long,_true>::get<true>(&state->group_idx_list,state->current_group);
  this_00 = &pPVar5->columns;
  ColumnReader::Stats((ColumnReader *)local_140,(idx_t)row_group_idx_p,
                      (vector<duckdb_parquet::ColumnChunk,_true> *)*pvVar8);
  this_03 = (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
             *)unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
               ::operator->(this_01);
  local_c8.type._0_8_ = i;
  iVar9 = ::std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
          ::find(this_03,(key_type *)&local_c8);
  if (((tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
       local_140._0_8_ != (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0) &&
     (pTVar10 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                ::operator->(this_01),
     (_Rb_tree_header *)iVar9._M_node != &(pTVar10->filters)._M_t._M_impl.super__Rb_tree_header)) {
    local_140._8_8_ =
         unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::operator*
                   ((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                     *)&iVar9._M_node[1]._M_parent);
    __n = row_group_idx_p->column_schema->column_index;
    PVar2 = row_group_idx_p->column_schema->schema_type;
    bVar14 = true;
    if ((__n < (ulong)(((long)(pPVar5->columns).
                              super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                              .
                              super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pPVar5->columns).
                             super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                             .
                             super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x280)) &&
       (pvVar11 = vector<duckdb_parquet::ColumnChunk,_true>::get<true>(this_00,__n),
       ((byte)(pvVar11->meta_data).statistics.__isset & 0x20) != 0)) {
      pvVar11 = vector<duckdb_parquet::ColumnChunk,_true>::get<true>
                          (this_00,row_group_idx_p->column_schema->column_index);
      bVar14 = ((byte)(pvVar11->meta_data).statistics.__isset & 0x10) == 0;
    }
    if (PVar2 != EXPRESSION) {
      if (bVar14) {
LAB_01ebe3bb:
        pBVar12 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                               *)local_140);
        FVar3 = (**(code **)(*(long *)local_140._8_8_ + 0x10))(local_140._8_8_,pBVar12);
      }
      else {
        LVar1 = (row_group_idx_p->column_schema->type).id_;
        if (LVar1 == VARCHAR) {
          pBVar12 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                 *)local_140);
          pvVar11 = vector<duckdb_parquet::ColumnChunk,_true>::get<true>
                              (this_00,row_group_idx_p->column_schema->column_index);
          FVar3 = CheckParquetStringFilter
                            (pBVar12,&(pvVar11->meta_data).statistics,(TableFilter *)local_140._8_8_
                            );
        }
        else {
          if ((LVar1 & ~SQLNULL) != FLOAT) goto LAB_01ebe3bb;
          local_130 = vector<duckdb_parquet::ColumnChunk,_true>::get<true>
                                (this_00,row_group_idx_p->column_schema->column_index);
          other = &row_group_idx_p->column_schema->type;
          LogicalType::LogicalType(&local_120,other);
          NumericStats::CreateUnknown(&local_c8,&local_120);
          LogicalType::~LogicalType(&local_120);
          Value::Value(&local_108,"nan");
          Value::DefaultCastAs(&local_70,&local_108,other,false);
          Value::~Value(&local_108);
          NumericStats::SetMin(&local_c8,&local_70);
          NumericStats::SetMax(&local_c8,&local_70);
          FVar4 = (**(code **)(*(long *)local_140._8_8_ + 0x10))(local_140._8_8_,&local_c8);
          ParquetStatisticsUtils::CreateNumericStats
                    ((ParquetStatisticsUtils *)&local_108,&row_group_idx_p->column_schema->type,
                     row_group_idx_p->column_schema,&(local_130->meta_data).statistics);
          pBVar12 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                 *)&local_108);
          FVar3 = (**(code **)(*(long *)local_140._8_8_ + 0x10))(local_140._8_8_,pBVar12);
          local_130 = (const_reference)
                      CONCAT71(local_130._1_7_,
                               FVar4 == NO_PRUNING_POSSIBLE || FVar3 == NO_PRUNING_POSSIBLE);
          if (FVar3 != FVar4) {
            FVar3 = NO_PRUNING_POSSIBLE;
          }
          ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
          ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                       *)&local_108);
          Value::~Value(&local_70);
          BaseStatistics::~BaseStatistics(&local_c8);
          if ((char)local_130 != '\0') goto LAB_01ebe590;
        }
      }
      if (FVar3 != NO_PRUNING_POSSIBLE) {
        if (FVar3 == FILTER_ALWAYS_FALSE) goto LAB_01ebe431;
        goto LAB_01ebe5ab;
      }
    }
LAB_01ebe590:
    uVar13 = (uint)(row_group_idx_p->column_schema->type).physical_type_;
    if (((0x1d < uVar13) || ((0x21800000U >> (uVar13 & 0x1f) & 1) == 0)) && (PVar2 == COLUMN)) {
      local_c8.type.id_ = (row_group_idx_p->column_schema->type).id_;
      bVar14 = ParquetStatisticsUtils::BloomFilterSupported((LogicalTypeId *)&local_c8);
      if (bVar14) {
        pvVar11 = vector<duckdb_parquet::ColumnChunk,_true>::get<true>
                            (this_00,row_group_idx_p->column_schema->column_index);
        bVar14 = ParquetStatisticsUtils::BloomFilterExcludes
                           ((TableFilter *)local_140._8_8_,&pvVar11->meta_data,
                            (state->thrift_file_proto)._M_t.
                            super___uniq_ptr_impl<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
                            .
                            super__Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false>
                            ._M_head_impl,this->allocator);
        if (bVar14) {
LAB_01ebe431:
          state->offset_in_group = pPVar5->num_rows;
          ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
          ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                       *)local_140);
          return;
        }
      }
    }
  }
LAB_01ebe5ab:
  ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
              local_140);
LAB_01ebe5b5:
  pCVar7 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->(local_128);
  pvVar8 = vector<unsigned_long,_true>::get<true>(&state->group_idx_list,state->current_group);
  (*pCVar7->_vptr_ColumnReader[2])
            (pCVar7,*pvVar8,&pPVar5->columns,
             (state->thrift_file_proto)._M_t.
             super___uniq_ptr_impl<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
             .super__Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false>.
             _M_head_impl);
  return;
}

Assistant:

void ParquetReader::PrepareRowGroupBuffer(ParquetReaderScanState &state, idx_t i) {
	auto &group = GetGroup(state);
	auto col_idx = MultiFileLocalIndex(i);
	auto column_id = column_ids[col_idx];
	auto &column_reader = state.root_reader->Cast<StructColumnReader>().GetChildReader(column_id);

	if (filters) {
		auto stats = column_reader.Stats(state.group_idx_list[state.current_group], group.columns);
		// filters contain output chunk index, not file col idx!
		auto filter_entry = filters->filters.find(col_idx);
		if (stats && filter_entry != filters->filters.end()) {
			auto &filter = *filter_entry->second;

			FilterPropagateResult prune_result;
			bool is_generated_column = column_reader.ColumnIndex() >= group.columns.size();
			bool is_column = column_reader.Schema().schema_type == ParquetColumnSchemaType::COLUMN;
			bool is_expression = column_reader.Schema().schema_type == ParquetColumnSchemaType::EXPRESSION;
			bool has_min_max = false;
			if (!is_generated_column) {
				has_min_max = group.columns[column_reader.ColumnIndex()].meta_data.statistics.__isset.min_value &&
				              group.columns[column_reader.ColumnIndex()].meta_data.statistics.__isset.max_value;
			}
			if (is_expression) {
				// no pruning possible for expressions
				prune_result = FilterPropagateResult::NO_PRUNING_POSSIBLE;
			} else if (!is_generated_column && has_min_max && column_reader.Type().id() == LogicalTypeId::VARCHAR) {
				// our StringStats only store the first 8 bytes of strings (even if Parquet has longer string stats)
				// however, when reading remote Parquet files, skipping row groups is really important
				// here, we implement a special case to check the full length for string filters
				prune_result = CheckParquetStringFilter(
				    *stats, group.columns[column_reader.ColumnIndex()].meta_data.statistics, filter);
			} else if (!is_generated_column && has_min_max &&
			           (column_reader.Type().id() == LogicalTypeId::FLOAT ||
			            column_reader.Type().id() == LogicalTypeId::DOUBLE)) {
				// floating point columns can have NaN values in addition to the min/max bounds defined in the file
				// in order to do optimal pruning - we prune based on the [min, max] of the file followed by pruning
				// based on nan
				prune_result = CheckParquetFloatFilter(
				    column_reader, group.columns[column_reader.ColumnIndex()].meta_data.statistics, filter);
			} else {
				prune_result = filter.CheckStatistics(*stats);
			}
			// check the bloom filter if present
			if (prune_result == FilterPropagateResult::NO_PRUNING_POSSIBLE && !column_reader.Type().IsNested() &&
			    is_column && ParquetStatisticsUtils::BloomFilterSupported(column_reader.Type().id()) &&
			    ParquetStatisticsUtils::BloomFilterExcludes(filter,
			                                                group.columns[column_reader.ColumnIndex()].meta_data,
			                                                *state.thrift_file_proto, allocator)) {
				prune_result = FilterPropagateResult::FILTER_ALWAYS_FALSE;
			}

			if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
				// this effectively will skip this chunk
				state.offset_in_group = group.num_rows;
				return;
			}
		}
	}

	state.root_reader->InitializeRead(state.group_idx_list[state.current_group], group.columns,
	                                  *state.thrift_file_proto);
}